

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O0

void Acec_ManPrintRanks(Vec_Int_t *vPairs)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  Vec_Int_t *vCounts;
  uint local_20;
  int RankMax;
  int Rank;
  int Count;
  int iObj;
  int k;
  Vec_Int_t *vPairs_local;
  
  vCounts._4_4_ = 0;
  p = Vec_IntStart(100);
  for (Count = 0; iVar1 = Vec_IntSize(vPairs), Count + 1 < iVar1; Count = Count + 2) {
    Vec_IntEntry(vPairs,Count);
    iVar1 = Vec_IntEntry(vPairs,Count + 1);
    Vec_IntFillExtra(p,iVar1 + 1,0);
    Vec_IntAddToEntry(p,iVar1,1);
    vCounts._4_4_ = Abc_MaxInt(vCounts._4_4_,iVar1);
  }
  for (local_20 = 1; (int)local_20 < vCounts._4_4_ + 1; local_20 = local_20 + 1) {
    uVar2 = Vec_IntEntry(p,local_20);
    printf("%2d=%2d ",(ulong)local_20,(ulong)uVar2);
  }
  printf("\n");
  Vec_IntFree(p);
  return;
}

Assistant:

void Acec_ManPrintRanks( Vec_Int_t * vPairs )
{
    int k, iObj, Count, Rank, RankMax = 0;
    Vec_Int_t * vCounts = Vec_IntStart( 100 );
    Vec_IntForEachEntryDouble( vPairs, iObj, Rank, k )
    {
        Vec_IntFillExtra( vCounts, Rank+1, 0 );
        Vec_IntAddToEntry( vCounts, Rank, 1 );
        RankMax = Abc_MaxInt( RankMax, Rank );
    }
    Vec_IntForEachEntryStartStop( vCounts, Count, Rank, 1, RankMax+1 )
        printf( "%2d=%2d ", Rank, Count );
    printf( "\n" );
    Vec_IntFree( vCounts );
}